

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgenPeeps.cpp
# Opt level: O2

bool __thiscall AgenPeeps::IsMemoryOpnd(AgenPeeps *this,Opnd *opnd)

{
  bool bVar1;
  
  bVar1 = IR::Opnd::IsSymOpnd(opnd);
  if (!bVar1) {
    bVar1 = IR::Opnd::IsIndirOpnd(opnd);
    if (!bVar1) {
      bVar1 = IR::Opnd::IsMemRefOpnd(opnd);
      return bVar1;
    }
  }
  return true;
}

Assistant:

bool AgenPeeps::IsMemoryOpnd(IR::Opnd *opnd)
{
    return opnd->IsSymOpnd() || opnd->IsIndirOpnd() || opnd->IsMemRefOpnd();
}